

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O1

char PromptForUserInputTimeout(UINT timeout)

{
  ssize_t sVar1;
  char buf [32];
  termios back;
  termios term;
  ulong local_b8 [4];
  termios local_98;
  termios local_54;
  
  fwrite("Press any key to continue . . . ",0x20,1,_stdout);
  fflush(_stdout);
  tcgetattr(0,&local_54);
  local_98.c_iflag = local_54.c_iflag;
  local_98.c_oflag = local_54.c_oflag;
  local_98.c_cc[7] = local_54.c_cc[7];
  local_98.c_cc[8] = local_54.c_cc[8];
  local_98.c_cc[9] = local_54.c_cc[9];
  local_98.c_cc[10] = local_54.c_cc[10];
  local_98.c_cc[0xb] = local_54.c_cc[0xb];
  local_98.c_cc[0xc] = local_54.c_cc[0xc];
  local_98.c_cc[0xd] = local_54.c_cc[0xd];
  local_98.c_cc[0xe] = local_54.c_cc[0xe];
  local_98.c_cc[0xf] = local_54.c_cc[0xf];
  local_98.c_cc[0x10] = local_54.c_cc[0x10];
  local_98.c_cc[0x11] = local_54.c_cc[0x11];
  local_98.c_cc[0x12] = local_54.c_cc[0x12];
  local_98.c_cc[0x13] = local_54.c_cc[0x13];
  local_98.c_cc[0x14] = local_54.c_cc[0x14];
  local_98.c_cc[0x15] = local_54.c_cc[0x15];
  local_98.c_cc[0x16] = local_54.c_cc[0x16];
  local_98.c_ispeed = local_54.c_ispeed;
  local_98.c_ospeed = local_54.c_ospeed;
  local_54.c_lflag = local_54.c_lflag & 0xfffffff5;
  local_54.c_cc[5] = (cc_t)(timeout / 100);
  local_54.c_cc[6] = '\0';
  tcsetattr(0,2,&local_54);
  tcflush(0,0);
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  sVar1 = read(0,local_b8,0x20);
  if (sVar1 == 0) {
    local_b8[0] = local_b8[0] & 0xffffffffffffff00;
  }
  tcsetattr(0,2,&local_98);
  fputc(10,_stdout);
  fflush(_stdout);
  return (char)local_b8[0];
}

Assistant:

char PromptForUserInputTimeout(UINT timeout)
{
#ifdef _WIN32
	HANDLE hStdin = INVALID_HANDLE_VALUE;
	DWORD fdwMode = 0, fdwSaveOldMode = 0;
	INPUT_RECORD irInBuf[1]; 
	DWORD cNumRead = 0;
	//char buf[32];
	//DWORD dwReadBytes = 0;
	CHRONO chrono;
	double duration = 0;

	fprintf(stdout, "Press any key to continue . . . ");
	fflush(stdout);

	hStdin = CreateFile(_T("CONIN$"), 
		GENERIC_READ|GENERIC_WRITE,
		FILE_SHARE_READ|FILE_SHARE_WRITE, 
		NULL, // No security attributes.
		OPEN_EXISTING, // Must use OPEN_EXISTING.
		0,    // Ignored for console.
		NULL  // Ignored for console.
		);

	//hStdin = GetStdHandle(STD_INPUT_HANDLE); 

	GetConsoleMode(hStdin, &fdwSaveOldMode);

	//fdwMode = fdwSaveOldMode&~(ENABLE_LINE_INPUT|ENABLE_ECHO_INPUT);
	fdwMode = ENABLE_PROCESSED_INPUT;

	SetConsoleMode(hStdin, fdwMode);

	FlushConsoleInputBuffer(hStdin);

	memset(irInBuf, 0, 1*sizeof(INPUT_RECORD));
	//memset(buf, 0, 32);

	//if (WaitForSingleObject(hStdin, (DWORD)timeout) == WAIT_OBJECT_0)
	//	ReadConsoleInput(hStdin, irInBuf, 1, &cNumRead);
	//	//ReadFile(hStdin, buf, 32, &dwReadBytes, NULL);

	StartChrono(&chrono);
	while (irInBuf->EventType != KEY_EVENT)
	{
		memset(irInBuf, 0, 1*sizeof(INPUT_RECORD));
		GetTimeElapsedChrono(&chrono, &duration);
		if ((int)timeout-(int)(duration*1000) > 0)
		{
			// min to try to handle also wrap around of the time in the integer values...
			timeout = (UINT)min((int)timeout-(int)(duration*1000), (int)timeout);
		}
		else
		{
			// We reached the timeout.
			break;
		}
		if (WaitForSingleObject(hStdin, (DWORD)timeout) == WAIT_OBJECT_0)
		{
			//PRINT_DEBUG_MESSAGE_OSMISC(("%s. \n", GetLastErrorMsg()));
			ReadConsoleInput(hStdin, irInBuf, 1, &cNumRead);
		}
	}
	StopChrono(&chrono, &duration);

	SetConsoleMode(hStdin, fdwSaveOldMode);
	
	//FlushConsoleInputBuffer(hStdin);

	CloseHandle(hStdin);

	fprintf(stdout, "\n");
	fflush(stdout);

	return (char)irInBuf[0].Event.KeyEvent.uChar.AsciiChar;
	//return buf[0];
#else 
	struct termios term, back;
	char buf[32];
	ssize_t nbbytes = 0;

	fprintf(stdout, "Press any key to continue . . . ");
	fflush(stdout);

	tcgetattr(STDIN_FILENO, &term); // Get the stdin terminal information.
	memcpy(&back, &term, sizeof(term)); // Save it.

	term.c_lflag &= ~(ICANON|ECHO); // Modify terminal options.
	term.c_cc[VTIME] = timeout/100; // Time to wait for every character read in tenths of seconds.
	term.c_cc[VMIN] = 0; // Minimum number of characters to read. 

	tcsetattr(STDIN_FILENO, TCSAFLUSH, &term); // Modify stdin attributes.

	tcflush(STDIN_FILENO, TCIFLUSH); // Flush any previous input on stdin.

	memset(buf, 0, 32);

	nbbytes = read(STDIN_FILENO, buf, 32); // Wait for a character.

	if (nbbytes == 0) buf[0] = 0;

	tcsetattr(STDIN_FILENO, TCSAFLUSH, &back); // Restore previous attributes.

	fprintf(stdout, "\n");
	fflush(stdout);

	return buf[0];
#endif // _WIN32
}